

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

bool * __thiscall
SmallDenseMap<unsigned_long,_bool,_PointerHasher,_1024U>::find
          (SmallDenseMap<unsigned_long,_bool,_PointerHasher,_1024U> *this,unsigned_long *key)

{
  uint uVar1;
  char acVar2 [8];
  char acVar3 [8];
  uint i;
  long lVar4;
  bool *pbVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  char data [8];
  
  uVar1 = this->bucketCount;
  acVar2 = (char  [8])*key;
  data[0] = acVar2[0];
  data[1] = acVar2[1];
  data[2] = acVar2[2];
  data[3] = acVar2[3];
  data[4] = acVar2[4];
  data[5] = acVar2[5];
  data[6] = acVar2[6];
  data[7] = acVar2[7];
  uVar6 = 0x1505;
  lVar4 = 0;
  do {
    uVar6 = (int)data[lVar4] + uVar6 * 0x21;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  if (uVar1 != 0) {
    uVar6 = uVar6 & uVar1 - 1;
    pbVar5 = (bool *)0x8;
    uVar7 = 1;
    do {
      acVar3 = (char  [8])this->data[uVar6].key;
      if (acVar3 == (char  [8])0x0) {
        bVar8 = false;
        pbVar5 = (bool *)0x0;
      }
      else if (acVar3 == acVar2) {
        pbVar5 = &this->data[uVar6].value;
        bVar8 = false;
      }
      else {
        uVar6 = uVar6 + uVar7 & uVar1 - 1;
        bVar8 = true;
      }
      if (!bVar8) {
        return pbVar5;
      }
      bVar8 = uVar7 != uVar1;
      uVar7 = uVar7 + 1;
    } while (bVar8);
  }
  return (bool *)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}